

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall QColorDialogPrivate::addCustom(QColorDialogPrivate *this)

{
  QRgb QVar1;
  int iVar2;
  int iVar3;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  
  iVar2 = *(int *)(in_RDI + 0x360);
  QVar1 = QtPrivate::QColorShower::currentColor(*(QColorShower **)(in_RDI + 0x310));
  QColorDialogOptions::setCustomColor(iVar2,QVar1);
  if (*(long *)(in_RDI + 0x2e0) != 0) {
    QWidget::update((QWidget *)CONCAT44(iVar2,in_stack_ffffffffffffffe8));
  }
  iVar2 = *(int *)(in_RDI + 0x360) + 1;
  iVar3 = QColorDialogOptions::customColorCount();
  *(int *)(in_RDI + 0x360) = iVar2 % iVar3;
  return;
}

Assistant:

void QColorDialogPrivate::addCustom()
{
    QColorDialogOptions::setCustomColor(nextCust, cs->currentColor());
    if (custom)
        custom->update();
    nextCust = (nextCust+1) % QColorDialogOptions::customColorCount();
}